

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDebuggerAdapterPipe.cxx
# Opt level: O2

bool testProtocolWithPipes(void)

{
  bool bVar1;
  future_status fVar2;
  TypeInfo *pTVar3;
  ostream *poVar4;
  pointer *__ptr;
  int iVar5;
  CMakeInitializeRequest *local_598;
  seconds futureTimeout;
  ConfigurationDoneRequest configurationDoneRequest;
  ScopedThread debuggerThread;
  future<void> startedListeningFuture;
  future<dap::ResponseOrError<dap::DisconnectResponse>_> local_568;
  shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX> client2Debugger;
  future<dap::ResponseOrError<dap::CMakeInitializeResponse>_> response;
  future<bool> disconnectResponseReceivedFuture;
  future<bool> threadExitedFuture;
  future<bool> threadStartedFuture;
  future<bool> terminatedEventReceivedFuture;
  future<bool> exitedEventReceivedFuture;
  future<bool> initializedEventReceivedFuture;
  future<bool> debuggerAdapterInitializedFuture;
  future<void> debuggerConnectionCreatedFuture;
  promise<bool> disconnectResponseReceivedPromise;
  promise<bool> threadStartedPromise;
  promise<bool> debuggerAdapterInitializedPromise;
  ResponseOrError<dap::DisconnectResponse> disconnectResponse;
  promise<bool> threadExitedPromise;
  promise<bool> terminatedEventReceivedPromise;
  promise<bool> exitedEventReceivedPromise;
  promise<bool> initializedEventReceivedPromise;
  promise<void> debuggerConnectionCreatedPromise;
  DisconnectRequest disconnectRequest;
  ResponseOrError<dap::ConfigurationDoneResponse> configurationDoneResponse;
  string namedPipe;
  LaunchRequest launchRequest;
  ResponseOrError<dap::CMakeInitializeResponse> initializeResponse;
  ResponseOrError<dap::LaunchResponse> launchResponse;
  CMakeInitializeRequest initializeRequest;
  
  std::promise<void>::promise(&debuggerConnectionCreatedPromise);
  std::__basic_future<void>::__basic_future
            (&debuggerConnectionCreatedFuture.super___basic_future<void>,
             &debuggerConnectionCreatedPromise._M_future);
  startedListeningFuture.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  startedListeningFuture.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::promise<bool>::promise(&debuggerAdapterInitializedPromise);
  std::__basic_future<bool>::__basic_future
            (&debuggerAdapterInitializedFuture.super___basic_future<bool>,
             &debuggerAdapterInitializedPromise._M_future);
  std::promise<bool>::promise(&initializedEventReceivedPromise);
  std::__basic_future<bool>::__basic_future
            (&initializedEventReceivedFuture.super___basic_future<bool>,
             (__state_type *)&initializedEventReceivedPromise);
  std::promise<bool>::promise(&exitedEventReceivedPromise);
  std::__basic_future<bool>::__basic_future
            (&exitedEventReceivedFuture.super___basic_future<bool>,
             (__state_type *)&exitedEventReceivedPromise);
  std::promise<bool>::promise(&terminatedEventReceivedPromise);
  std::__basic_future<bool>::__basic_future
            (&terminatedEventReceivedFuture.super___basic_future<bool>,
             (__state_type *)&terminatedEventReceivedPromise);
  std::promise<bool>::promise(&threadStartedPromise);
  std::__basic_future<bool>::__basic_future
            (&threadStartedFuture.super___basic_future<bool>,&threadStartedPromise._M_future);
  std::promise<bool>::promise(&threadExitedPromise);
  std::__basic_future<bool>::__basic_future
            (&threadExitedFuture.super___basic_future<bool>,(__state_type *)&threadExitedPromise);
  std::promise<bool>::promise(&disconnectResponseReceivedPromise);
  std::__basic_future<bool>::__basic_future
            (&disconnectResponseReceivedFuture.super___basic_future<bool>,
             &disconnectResponseReceivedPromise._M_future);
  futureTimeout.__r = 0x3c;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&namedPipe,"CMakeDebuggerPipe2",(allocator<char> *)&initializeResponse);
  dap::Session::create();
  pTVar3 = dap::TypeOf<dap::InitializedEvent>::type();
  initializeResponse.response.additionalModuleColumns.val.
  super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  initializeResponse.response.additionalModuleColumns._24_8_ =
       std::
       _Function_handler<void_(const_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:397:13)>
       ::_M_invoke;
  initializeResponse.response.additionalModuleColumns.val.
  super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(const_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:397:13)>
                ::_M_manager;
  initializeResponse.response.additionalModuleColumns.val.
  super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&initializedEventReceivedPromise;
  (**(code **)((local_598->adapterID)._M_dataplus._M_p + 0x40))(local_598,pTVar3);
  std::_Function_base::~_Function_base((_Function_base *)&initializeResponse);
  pTVar3 = dap::TypeOf<dap::ExitedEvent>::type();
  initializeResponse.response.additionalModuleColumns.val.
  super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  initializeResponse.response.additionalModuleColumns._24_8_ =
       std::
       _Function_handler<void_(const_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:397:13)>
       ::_M_invoke;
  initializeResponse.response.additionalModuleColumns.val.
  super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(const_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:397:13)>
                ::_M_manager;
  initializeResponse.response.additionalModuleColumns.val.
  super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&exitedEventReceivedPromise;
  (**(code **)((local_598->adapterID)._M_dataplus._M_p + 0x40))(local_598,pTVar3);
  std::_Function_base::~_Function_base((_Function_base *)&initializeResponse);
  pTVar3 = dap::TypeOf<dap::TerminatedEvent>::type();
  initializeResponse.response.additionalModuleColumns.val.
  super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  initializeResponse.response.additionalModuleColumns._24_8_ =
       std::
       _Function_handler<void_(const_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:397:13)>
       ::_M_invoke;
  initializeResponse.response.additionalModuleColumns.val.
  super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(const_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:397:13)>
                ::_M_manager;
  initializeResponse.response.additionalModuleColumns.val.
  super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&terminatedEventReceivedPromise;
  (**(code **)((local_598->adapterID)._M_dataplus._M_p + 0x40))(local_598,pTVar3);
  std::_Function_base::~_Function_base((_Function_base *)&initializeResponse);
  initializeResponse.response.additionalModuleColumns.val.
  super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&threadStartedPromise;
  initializeResponse.response.additionalModuleColumns.val.
  super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&threadExitedPromise;
  pTVar3 = dap::TypeOf<dap::ThreadEvent>::type();
  initializeResponse.response.additionalModuleColumns._24_8_ =
       std::
       _Function_handler<void_(const_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:397:13)>
       ::_M_invoke;
  initializeResponse.response.additionalModuleColumns.val.
  super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(const_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:397:13)>
                ::_M_manager;
  (**(code **)((local_598->adapterID)._M_dataplus._M_p + 0x40))(local_598,pTVar3);
  std::_Function_base::~_Function_base((_Function_base *)&initializeResponse);
  debuggerThread.Thread._M_id._M_thread = (thread)(id)0x0;
  initializeResponse.response.additionalModuleColumns.val.
  super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x38);
  ((initializeResponse.response.additionalModuleColumns.val.
    super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>._M_impl.
    super__Vector_impl_data._M_start)->attributeName)._M_dataplus._M_p =
       (pointer)&PTR___State_00a9b3c8;
  ((initializeResponse.response.additionalModuleColumns.val.
    super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>._M_impl.
    super__Vector_impl_data._M_start)->attributeName)._M_string_length = (size_type)&namedPipe;
  ((initializeResponse.response.additionalModuleColumns.val.
    super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>._M_impl.
    super__Vector_impl_data._M_start)->attributeName).field_2._M_allocated_capacity =
       (size_type)&startedListeningFuture;
  *(promise<void> **)
   ((long)&((initializeResponse.response.additionalModuleColumns.val.
             super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>.
             _M_impl.super__Vector_impl_data._M_start)->attributeName).field_2 + 8) =
       &debuggerConnectionCreatedPromise;
  ((initializeResponse.response.additionalModuleColumns.val.
    super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>._M_impl.
    super__Vector_impl_data._M_start)->format).val._M_dataplus._M_p =
       (pointer)&debuggerAdapterInitializedPromise;
  ((initializeResponse.response.additionalModuleColumns.val.
    super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>._M_impl.
    super__Vector_impl_data._M_start)->format).val._M_string_length =
       (size_type)&disconnectResponseReceivedFuture;
  ((initializeResponse.response.additionalModuleColumns.val.
    super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>._M_impl.
    super__Vector_impl_data._M_start)->format).val.field_2._M_allocated_capacity =
       (size_type)&futureTimeout;
  std::thread::_M_start_thread(&debuggerThread,&initializeResponse,0);
  if (initializeResponse.response.additionalModuleColumns.val.
      super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(((initializeResponse.response.additionalModuleColumns.val.
                   super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>
                   ._M_impl.super__Vector_impl_data._M_start)->attributeName)._M_dataplus._M_p + 8))
              ();
  }
  fVar2 = std::__basic_future<void>::wait_for<long,std::ratio<1l,1l>>
                    (&debuggerConnectionCreatedFuture.super___basic_future<void>,&futureTimeout);
  if (fVar2 == ready) {
    fVar2 = std::__basic_future<void>::wait_for<long,std::ratio<1l,1l>>
                      (&startedListeningFuture.super___basic_future<void>,&futureTimeout);
    if (fVar2 == ready) {
      std::make_shared<cmDebugger::cmDebuggerPipeClient_POSIX,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &client2Debugger);
      cmDebugger::cmDebuggerPipeClient_POSIX::WaitForConnection
                (client2Debugger.
                 super___shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      std::__shared_ptr<dap::Reader,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,void>
                ((__shared_ptr<dap::Reader,(__gnu_cxx::_Lock_policy)2> *)&initializeRequest,
                 &client2Debugger.
                  super___shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,_(__gnu_cxx::_Lock_policy)2>
                );
      std::__shared_ptr<dap::Writer,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,void>
                ((__shared_ptr<dap::Writer,(__gnu_cxx::_Lock_policy)2> *)&launchRequest,
                 &client2Debugger.
                  super___shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,_(__gnu_cxx::_Lock_policy)2>
                );
      initializeResponse.response.additionalModuleColumns.val.
      super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      initializeResponse.response.additionalModuleColumns.set = false;
      initializeResponse.response.additionalModuleColumns._25_7_ = 0;
      initializeResponse.response.additionalModuleColumns.val.
      super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      initializeResponse.response.additionalModuleColumns.val.
      super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      dap::Session::bind((Session *)local_598,(int)&initializeRequest,(sockaddr *)&launchRequest,
                         (socklen_t)&initializeResponse);
      std::_Function_base::~_Function_base((_Function_base *)&initializeResponse);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&launchRequest.restart.val.value.type
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &initializeRequest.adapterID._M_string_length);
      initializeRequest.adapterID._M_dataplus._M_p = (pointer)&initializeRequest.adapterID.field_2;
      initializeRequest.adapterID._M_string_length = 0;
      initializeRequest.adapterID.field_2._M_local_buf[0] = '\0';
      initializeRequest.clientID.val._M_dataplus._M_p =
           (pointer)&initializeRequest.clientID.val.field_2;
      initializeRequest.clientID.val._M_string_length = 0;
      initializeRequest.clientID.val.field_2._M_local_buf[0] = '\0';
      initializeRequest.clientID.set = false;
      initializeRequest.clientName.val._M_dataplus._M_p =
           (pointer)&initializeRequest.clientName.val.field_2;
      initializeRequest.clientName.val._M_string_length = 0;
      initializeRequest.clientName.val.field_2._M_local_buf[0] = '\0';
      initializeRequest.clientName.set = false;
      initializeRequest.locale.val._M_dataplus._M_p = (pointer)&initializeRequest.locale.val.field_2
      ;
      initializeRequest.columnsStartAt1.val.val = false;
      initializeRequest.columnsStartAt1.set = false;
      initializeRequest.linesStartAt1.val.val = false;
      initializeRequest.linesStartAt1.set = false;
      initializeRequest.locale.val._M_string_length = 0;
      initializeRequest.locale.val.field_2._M_local_buf[0] = '\0';
      initializeRequest.locale.set = false;
      initializeRequest.pathFormat.val._M_dataplus._M_p =
           (pointer)&initializeRequest.pathFormat.val.field_2;
      initializeRequest.pathFormat.val._M_string_length = 0;
      initializeRequest.pathFormat.val.field_2._M_local_buf[0] = '\0';
      initializeRequest.pathFormat.set = false;
      initializeRequest.supportsArgsCanBeInterpretedByShell.val.val = false;
      initializeRequest.supportsArgsCanBeInterpretedByShell.set = false;
      initializeRequest.supportsInvalidatedEvent.val.val = false;
      initializeRequest.supportsInvalidatedEvent.set = false;
      initializeRequest.supportsMemoryEvent.val.val = false;
      initializeRequest.supportsMemoryEvent.set = false;
      initializeRequest.supportsMemoryReferences.val.val = false;
      initializeRequest.supportsMemoryReferences.set = false;
      initializeRequest.supportsProgressReporting.val.val = false;
      initializeRequest.supportsProgressReporting.set = false;
      initializeRequest.supportsRunInTerminalRequest.val.val = false;
      initializeRequest.supportsRunInTerminalRequest.set = false;
      initializeRequest.supportsStartDebuggingRequest.val.val = false;
      initializeRequest.supportsStartDebuggingRequest.set = false;
      initializeRequest.supportsVariablePaging.val.val = false;
      initializeRequest.supportsVariablePaging.set = false;
      initializeRequest.supportsVariableType.val.val = false;
      initializeRequest.supportsVariableType.set = false;
      dap::Session::send<dap::CMakeInitializeRequest,void>((Session *)&response,local_598);
      dap::future<dap::ResponseOrError<dap::CMakeInitializeResponse>_>::get
                (&initializeResponse,&response);
      if (initializeResponse.error.message._M_string_length == 0) {
        bVar1 = std::operator==(&initializeResponse.response.cmakeVersion.full,
                                "3.29.20240330-ge5f7ff8");
        if (!bVar1) {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(initializeResponse.response.cmakeVersion.full == CMake_VERSION) failed on line "
                                  );
          iVar5 = 0x8d;
          goto LAB_001d5776;
        }
        if (initializeResponse.response.cmakeVersion.major.val != 3) {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(initializeResponse.response.cmakeVersion.major == CMake_VERSION_MAJOR) failed on line "
                                  );
          iVar5 = 0x8f;
          goto LAB_001d5776;
        }
        if (initializeResponse.response.cmakeVersion.minor.val != 0x1d) {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(initializeResponse.response.cmakeVersion.minor == CMake_VERSION_MINOR) failed on line "
                                  );
          iVar5 = 0x91;
          goto LAB_001d5776;
        }
        if (initializeResponse.response.cmakeVersion.patch.val != 0x134d7ca) {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(initializeResponse.response.cmakeVersion.patch == CMake_VERSION_PATCH) failed on line "
                                  );
          iVar5 = 0x93;
          goto LAB_001d5776;
        }
        if (initializeResponse.response.supportsExceptionInfoRequest.set == false) {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(initializeResponse.response.supportsExceptionInfoRequest) failed on line "
                                  );
          iVar5 = 0x94;
          goto LAB_001d5776;
        }
        if (initializeResponse.response.exceptionBreakpointFilters.set == false) {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(initializeResponse.response.exceptionBreakpointFilters.has_value()) failed on line "
                                  );
          iVar5 = 0x96;
          goto LAB_001d5776;
        }
        dap::LaunchRequest::LaunchRequest(&launchRequest);
        dap::Session::send<dap::LaunchRequest,void>
                  ((Session *)&configurationDoneResponse,(LaunchRequest *)local_598);
        dap::future<dap::ResponseOrError<dap::LaunchResponse>_>::get
                  (&launchResponse,
                   (future<dap::ResponseOrError<dap::LaunchResponse>_> *)&configurationDoneResponse)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&configurationDoneResponse.error);
        if (launchResponse.error.message._M_string_length == 0) {
          dap::Session::send<dap::ConfigurationDoneRequest,void>
                    ((Session *)&disconnectResponse,(ConfigurationDoneRequest *)local_598);
          dap::future<dap::ResponseOrError<dap::ConfigurationDoneResponse>_>::get
                    (&configurationDoneResponse,
                     (future<dap::ResponseOrError<dap::ConfigurationDoneResponse>_> *)
                     &disconnectResponse);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&disconnectResponse.error);
          if (configurationDoneResponse.error.message._M_string_length == 0) {
            fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>
                              (&debuggerAdapterInitializedFuture.super___basic_future<bool>,
                               &futureTimeout);
            if (fVar2 != ready) {
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(debuggerAdapterInitializedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                                      );
              iVar5 = 0xa1;
              goto LAB_001d594a;
            }
            fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>
                              (&initializedEventReceivedFuture.super___basic_future<bool>,
                               &futureTimeout);
            if (fVar2 != ready) {
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(initializedEventReceivedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                                      );
              iVar5 = 0xa3;
              goto LAB_001d594a;
            }
            fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>
                              (&terminatedEventReceivedFuture.super___basic_future<bool>,
                               &futureTimeout);
            if (fVar2 != ready) {
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(terminatedEventReceivedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                                      );
              iVar5 = 0xa5;
              goto LAB_001d594a;
            }
            fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>
                              (&threadStartedFuture.super___basic_future<bool>,&futureTimeout);
            if (fVar2 != ready) {
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(threadStartedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                                      );
              iVar5 = 0xa7;
              goto LAB_001d594a;
            }
            fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>
                              (&threadExitedFuture.super___basic_future<bool>,&futureTimeout);
            if (fVar2 != ready) {
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(threadExitedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                                      );
              iVar5 = 0xa9;
              goto LAB_001d594a;
            }
            fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>
                              (&exitedEventReceivedFuture.super___basic_future<bool>,&futureTimeout)
            ;
            if (fVar2 != ready) {
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(exitedEventReceivedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                                      );
              iVar5 = 0xab;
              goto LAB_001d594a;
            }
            dap::Session::send<dap::DisconnectRequest,void>
                      ((Session *)&local_568,(DisconnectRequest *)local_598);
            dap::future<dap::ResponseOrError<dap::DisconnectResponse>_>::get
                      (&disconnectResponse,&local_568);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_568.state.
                        super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::DisconnectResponse>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            local_568.state.
            super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::DisconnectResponse>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_1_ = 1;
            std::promise<bool>::set_value(&disconnectResponseReceivedPromise,(bool *)&local_568);
            bVar1 = disconnectResponse.error.message._M_string_length == 0;
            if (!bVar1) {
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(!disconnectResponse.error) failed on line ");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xb0);
              std::operator<<(poVar4,"\n");
            }
            std::__cxx11::string::~string((string *)&disconnectResponse.error);
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(!configurationDoneResponse.error) failed on line "
                                    );
            iVar5 = 0x9e;
LAB_001d594a:
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
            std::operator<<(poVar4,"\n");
            bVar1 = false;
          }
          std::__cxx11::string::~string((string *)&configurationDoneResponse.error);
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(!launchResponse.error) failed on line ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x99);
          std::operator<<(poVar4,"\n");
          bVar1 = false;
        }
        std::__cxx11::string::~string((string *)&launchResponse.error);
        dap::any::~any((any *)&launchRequest);
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(!initializeResponse.error) failed on line ");
        iVar5 = 0x8c;
LAB_001d5776:
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
        std::operator<<(poVar4,"\n");
        bVar1 = false;
      }
      dap::ResponseOrError<dap::CMakeInitializeResponse>::~ResponseOrError(&initializeResponse);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&response.state.
                  super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::CMakeInitializeResponse>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      dap::CMakeInitializeRequest::~CMakeInitializeRequest(&initializeRequest);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&client2Debugger.
                  super___shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      goto LAB_001d5373;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(startedListeningFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                            );
    iVar5 = 0x81;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(debuggerConnectionCreatedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                            );
    iVar5 = 0x7f;
  }
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
  std::operator<<(poVar4,"\n");
  bVar1 = false;
LAB_001d5373:
  ScopedThread::~ScopedThread(&debuggerThread);
  if (local_598 != (CMakeInitializeRequest *)0x0) {
    (**(code **)((local_598->adapterID)._M_dataplus._M_p + 8))();
  }
  std::__cxx11::string::~string((string *)&namedPipe);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&disconnectResponseReceivedFuture.super___basic_future<bool>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<bool>::~promise(&disconnectResponseReceivedPromise);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&threadExitedFuture.super___basic_future<bool>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<bool>::~promise(&threadExitedPromise);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&threadStartedFuture.super___basic_future<bool>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<bool>::~promise(&threadStartedPromise);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&terminatedEventReceivedFuture.super___basic_future<bool>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<bool>::~promise(&terminatedEventReceivedPromise);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&exitedEventReceivedFuture.super___basic_future<bool>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<bool>::~promise(&exitedEventReceivedPromise);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&initializedEventReceivedFuture.super___basic_future<bool>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<bool>::~promise(&initializedEventReceivedPromise);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&debuggerAdapterInitializedFuture.super___basic_future<bool>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<bool>::~promise(&debuggerAdapterInitializedPromise);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&startedListeningFuture.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&debuggerConnectionCreatedFuture.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<void>::~promise(&debuggerConnectionCreatedPromise);
  return bVar1;
}

Assistant:

bool testProtocolWithPipes()
{
  std::promise<void> debuggerConnectionCreatedPromise;
  std::future<void> debuggerConnectionCreatedFuture =
    debuggerConnectionCreatedPromise.get_future();

  std::future<void> startedListeningFuture;

  std::promise<bool> debuggerAdapterInitializedPromise;
  std::future<bool> debuggerAdapterInitializedFuture =
    debuggerAdapterInitializedPromise.get_future();

  std::promise<bool> initializedEventReceivedPromise;
  std::future<bool> initializedEventReceivedFuture =
    initializedEventReceivedPromise.get_future();

  std::promise<bool> exitedEventReceivedPromise;
  std::future<bool> exitedEventReceivedFuture =
    exitedEventReceivedPromise.get_future();

  std::promise<bool> terminatedEventReceivedPromise;
  std::future<bool> terminatedEventReceivedFuture =
    terminatedEventReceivedPromise.get_future();

  std::promise<bool> threadStartedPromise;
  std::future<bool> threadStartedFuture = threadStartedPromise.get_future();

  std::promise<bool> threadExitedPromise;
  std::future<bool> threadExitedFuture = threadExitedPromise.get_future();

  std::promise<bool> disconnectResponseReceivedPromise;
  std::future<bool> disconnectResponseReceivedFuture =
    disconnectResponseReceivedPromise.get_future();

  auto futureTimeout = std::chrono::seconds(60);

#ifdef _WIN32
  std::string namedPipe = R"(\\.\pipe\LOCAL\CMakeDebuggerPipe2_)" +
    cmCryptoHash(cmCryptoHash::AlgoSHA256)
      .HashString(cmSystemTools::GetCurrentWorkingDirectory());
#else
  std::string namedPipe = "CMakeDebuggerPipe2";
#endif

  std::unique_ptr<dap::Session> client = dap::Session::create();
  client->registerHandler([&](const dap::InitializedEvent& e) {
    (void)e;
    initializedEventReceivedPromise.set_value(true);
  });
  client->registerHandler([&](const dap::ExitedEvent& e) {
    (void)e;
    exitedEventReceivedPromise.set_value(true);
  });
  client->registerHandler([&](const dap::TerminatedEvent& e) {
    (void)e;
    terminatedEventReceivedPromise.set_value(true);
  });
  client->registerHandler([&](const dap::ThreadEvent& e) {
    if (e.reason == "started") {
      threadStartedPromise.set_value(true);
    } else if (e.reason == "exited") {
      threadExitedPromise.set_value(true);
    }
  });

  ScopedThread debuggerThread([&]() -> int {
    try {
      auto connection =
        std::make_shared<cmDebugger::cmDebuggerPipeConnection>(namedPipe);
      startedListeningFuture = connection->StartedListening.get_future();
      debuggerConnectionCreatedPromise.set_value();
      std::shared_ptr<cmDebugger::cmDebuggerAdapter> debuggerAdapter =
        std::make_shared<cmDebugger::cmDebuggerAdapter>(
          connection, dap::file(stdout, false));

      debuggerAdapterInitializedPromise.set_value(true);
      debuggerAdapter->ReportExitCode(0);

      // Ensure the disconnectResponse has been received before
      // destructing debuggerAdapter.
      ASSERT_TRUE(disconnectResponseReceivedFuture.wait_for(futureTimeout) ==
                  std::future_status::ready);
      return 0;
    } catch (const std::runtime_error& error) {
      std::cerr << "Error: Failed to create debugger adapter.\n";
      std::cerr << error.what() << "\n";
      return -1;
    }
  });

  ASSERT_TRUE(debuggerConnectionCreatedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);
  ASSERT_TRUE(startedListeningFuture.wait_for(futureTimeout) ==
              std::future_status::ready);

  auto client2Debugger =
    std::make_shared<cmDebugger::cmDebuggerPipeClient>(namedPipe);

  client2Debugger->WaitForConnection();
  client->bind(client2Debugger, client2Debugger);

  dap::CMakeInitializeRequest initializeRequest;
  auto response = client->send(initializeRequest);
  auto initializeResponse = response.get();
  ASSERT_TRUE(!initializeResponse.error);
  ASSERT_TRUE(initializeResponse.response.cmakeVersion.full == CMake_VERSION);
  ASSERT_TRUE(initializeResponse.response.cmakeVersion.major ==
              CMake_VERSION_MAJOR);
  ASSERT_TRUE(initializeResponse.response.cmakeVersion.minor ==
              CMake_VERSION_MINOR);
  ASSERT_TRUE(initializeResponse.response.cmakeVersion.patch ==
              CMake_VERSION_PATCH);
  ASSERT_TRUE(initializeResponse.response.supportsExceptionInfoRequest);
  ASSERT_TRUE(
    initializeResponse.response.exceptionBreakpointFilters.has_value());
  dap::LaunchRequest launchRequest;
  auto launchResponse = client->send(launchRequest).get();
  ASSERT_TRUE(!launchResponse.error);

  dap::ConfigurationDoneRequest configurationDoneRequest;
  auto configurationDoneResponse =
    client->send(configurationDoneRequest).get();
  ASSERT_TRUE(!configurationDoneResponse.error);

  ASSERT_TRUE(debuggerAdapterInitializedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);
  ASSERT_TRUE(initializedEventReceivedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);
  ASSERT_TRUE(terminatedEventReceivedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);
  ASSERT_TRUE(threadStartedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);
  ASSERT_TRUE(threadExitedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);
  ASSERT_TRUE(exitedEventReceivedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);

  dap::DisconnectRequest disconnectRequest;
  auto disconnectResponse = client->send(disconnectRequest).get();
  disconnectResponseReceivedPromise.set_value(true);
  ASSERT_TRUE(!disconnectResponse.error);

  return true;
}